

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local-graph.h
# Opt level: O0

GetInfluences * __thiscall wasm::LocalGraph::getGetInfluences(LocalGraph *this,LocalGet *get)

{
  bool bVar1;
  int iVar2;
  pointer pvVar3;
  _Node_iterator_base<std::pair<wasm::LocalGet_*const,_std::unordered_set<wasm::LocalSet_*,_std::hash<wasm::LocalSet_*>,_std::equal_to<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>,_false>
  local_30;
  _Node_iterator_base<std::pair<wasm::LocalGet_*const,_std::unordered_set<wasm::LocalSet_*,_std::hash<wasm::LocalSet_*>,_std::equal_to<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>,_false>
  local_28;
  const_iterator iter;
  LocalGet *get_local;
  LocalGraph *this_local;
  
  iter.
  super__Node_iterator_base<std::pair<wasm::LocalGet_*const,_std::unordered_set<wasm::LocalSet_*,_std::hash<wasm::LocalSet_*>,_std::equal_to<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>,_false>
  ._M_cur = (_Node_iterator_base<std::pair<wasm::LocalGet_*const,_std::unordered_set<wasm::LocalSet_*,_std::hash<wasm::LocalSet_*>,_std::equal_to<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>,_false>
             )(_Node_iterator_base<std::pair<wasm::LocalGet_*const,_std::unordered_set<wasm::LocalSet_*,_std::hash<wasm::LocalSet_*>,_std::equal_to<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>,_false>
               )get;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::LocalGet_*,_std::unordered_set<wasm::LocalSet_*,_std::hash<wasm::LocalSet_*>,_std::equal_to<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<std::pair<wasm::LocalGet_*const,_std::unordered_set<wasm::LocalSet_*,_std::hash<wasm::LocalSet_*>,_std::equal_to<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>_>_>
       ::find(&this->getInfluences,(key_type *)&iter);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::LocalGet_*,_std::unordered_set<wasm::LocalSet_*,_std::hash<wasm::LocalSet_*>,_std::equal_to<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<std::pair<wasm::LocalGet_*const,_std::unordered_set<wasm::LocalSet_*,_std::hash<wasm::LocalSet_*>,_std::equal_to<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>_>_>
       ::end(&this->getInfluences);
  bVar1 = std::__detail::operator==(&local_28,&local_30);
  if (bVar1) {
    if (getGetInfluences(wasm::LocalGet*)::empty == '\0') {
      iVar2 = __cxa_guard_acquire(&getGetInfluences(wasm::LocalGet*)::empty);
      if (iVar2 != 0) {
        std::
        unordered_set<wasm::LocalSet_*,_std::hash<wasm::LocalSet_*>,_std::equal_to<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>
        ::unordered_set(&getGetInfluences::empty);
        __cxa_atexit(std::
                     unordered_set<wasm::LocalSet_*,_std::hash<wasm::LocalSet_*>,_std::equal_to<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>
                     ::~unordered_set,&getGetInfluences::empty,&__dso_handle);
        __cxa_guard_release(&getGetInfluences(wasm::LocalGet*)::empty);
      }
    }
    this_local = (LocalGraph *)&getGetInfluences::empty;
  }
  else {
    pvVar3 = std::__detail::
             _Node_const_iterator<std::pair<wasm::LocalGet_*const,_std::unordered_set<wasm::LocalSet_*,_std::hash<wasm::LocalSet_*>,_std::equal_to<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>,_false,_false>
             ::operator->((_Node_const_iterator<std::pair<wasm::LocalGet_*const,_std::unordered_set<wasm::LocalSet_*,_std::hash<wasm::LocalSet_*>,_std::equal_to<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>,_false,_false>
                           *)&local_28);
    this_local = (LocalGraph *)&pvVar3->second;
  }
  return (GetInfluences *)this_local;
}

Assistant:

const GetInfluences& getGetInfluences(LocalGet* get) const {
    auto iter = getInfluences.find(get);
    if (iter == getInfluences.end()) {
      // Use a canonical constant empty set to avoid allocation.
      static const GetInfluences empty;
      return empty;
    }
    return iter->second;
  }